

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexTriangleKernel.cpp
# Opt level: O2

void Ptex::v2_2::(anonymous_namespace)::Apply<unsigned_short,1>
               (PtexTriangleKernelIter *k,float *result,void *data,int param_4,int param_5)

{
  ushort *puVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ushort *puVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  fVar2 = k->A;
  for (iVar5 = k->v1; iVar5 != k->v2; iVar5 = iVar5 + 1) {
    iVar3 = k->rowlen - iVar5;
    iVar4 = iVar3 - k->w2;
    if (iVar4 < k->u1) {
      iVar4 = k->u1;
    }
    iVar3 = iVar3 - k->w1;
    if (k->u2 < iVar3) {
      iVar3 = k->u2;
    }
    fVar7 = (float)iVar4 - k->u;
    fVar8 = (float)iVar5 - k->v;
    fVar9 = (fVar7 + fVar7 + 1.0) * k->A + fVar8 * k->B;
    fVar7 = k->A * fVar7 * fVar7 + (k->B * fVar7 + k->C * fVar8) * fVar8;
    puVar6 = (ushort *)((long)data + (long)(k->rowlen * iVar5 + iVar4) * 2);
    puVar1 = puVar6 + (iVar3 - iVar4);
    for (; puVar6 < puVar1; puVar6 = puVar6 + 1) {
      if (fVar7 < 1.0) {
        fVar8 = anon_unknown_2::gaussian(fVar7);
        fVar8 = fVar8 * k->wscale;
        k->weight = k->weight + fVar8;
        *result = (float)*puVar6 * fVar8 + *result;
      }
      fVar7 = fVar7 + fVar9;
      fVar9 = fVar9 + fVar2 + fVar2;
    }
  }
  return;
}

Assistant:

void Apply(PtexTriangleKernelIter& k, float* result, void* data, int /*nChan*/, int /*nTxChan*/)
    {
        int nTxChan = nChan;
        float DDQ = 2.0f*k.A;
        for (int vi = k.v1; vi != k.v2; vi++) {
            int xw = k.rowlen - vi;
            int x1 = PtexUtils::max(k.u1, xw-k.w2);
            int x2 = PtexUtils::min(k.u2, xw-k.w1);
            float U = (float)x1 - k.u;
            float V = (float)vi - k.v;
            float DQ = k.A*(2.0f*U+1.0f)+k.B*V;
            float Q = k.A*U*U + (k.B*U + k.C*V)*V;
            T* p = static_cast<T*>(data) + (vi * k.rowlen + x1) * nTxChan;
            T* pEnd = p + (x2-x1)*nTxChan;
            for (; p < pEnd; p += nTxChan) {
                if (Q < 1.0f) {
                    float weight = gaussian(Q)*k.wscale;
                    k.weight += weight;
                    PtexUtils::VecAccum<T,nChan>()(result, p, weight);
                }
                Q += DQ;
                DQ += DDQ;
            }
        }
    }